

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void apu_square(nesapu_state *info,square_t *chan)

{
  uint32 uVar1;
  byte local_21;
  uint8 freq_index;
  int sweep_delay;
  int env_delay;
  square_t *chan_local;
  nesapu_state *info_local;
  
  if (((chan->enabled & 1U) == 0) || ((chan->Muted & 1U) != 0)) {
    chan->output = '\0';
  }
  else {
    uVar1 = info->sync_times1[(int)(chan->regs[0] & 0xf)];
    chan->env_phase = chan->env_phase - 4.0;
    while (chan->env_phase <= 0.0 && chan->env_phase != 0.0) {
      chan->env_phase = (float)(int)uVar1 + chan->env_phase;
      if ((chan->regs[0] & 0x20) == 0) {
        if (chan->env_vol < 0xf) {
          chan->env_vol = chan->env_vol + '\x01';
        }
      }
      else {
        chan->env_vol = chan->env_vol + 1 & 0xf;
      }
    }
    if ((0 < chan->vbl_length) && ((chan->regs[0] & 0x20) == 0)) {
      chan->vbl_length = chan->vbl_length + -1;
    }
    if (chan->vbl_length == 0) {
      chan->output = '\0';
    }
    else {
      if (((chan->regs[1] & 0x80) != 0) && ((chan->regs[1] & 7) != 0)) {
        uVar1 = info->sync_times1[(int)((int)(uint)chan->regs[1] >> 4 & 7)];
        chan->sweep_phase = chan->sweep_phase - 2.0;
        while (chan->sweep_phase <= 0.0 && chan->sweep_phase != 0.0) {
          chan->sweep_phase = (float)(int)uVar1 + chan->sweep_phase;
          if ((chan->regs[1] & 8) == 0) {
            chan->freq = (chan->freq >> (chan->regs[1] & 7)) + chan->freq;
          }
          else {
            chan->freq = chan->freq - (chan->freq >> (chan->regs[1] & 7));
          }
        }
      }
      if ((chan->regs[1] & 0x80) == 0) {
        local_21 = 7;
      }
      else {
        local_21 = chan->regs[1] & 7;
      }
      if ((((chan->regs[1] & 8) == 0) && (freq_limit[local_21] < chan->freq >> 0x10)) ||
         (chan->freq >> 0x10 < 4)) {
        chan->output = '\0';
      }
      else {
        chan->phaseacc = chan->phaseacc - info->apu_incsize;
        while (chan->phaseacc <= 0.0 && chan->phaseacc != 0.0) {
          chan->phaseacc = (float)(chan->freq >> 0x10) + chan->phaseacc;
          chan->adder = chan->adder + 1 & 0xf;
        }
        if ((chan->regs[0] & 0x10) == 0) {
          chan->output = '\x0f' - chan->env_vol;
        }
        else {
          chan->output = chan->regs[0] & 0xf;
        }
        if ((duty_lut[(int)(uint)chan->regs[0] >> 6] &
            1 << (7U - (char)((int)(uint)chan->adder >> 1) & 0x1f)) != 0) {
          chan->output = -chan->output;
        }
      }
    }
  }
  return;
}

Assistant:

static void apu_square(nesapu_state *info, square_t *chan)
{
	int env_delay;
	int sweep_delay;
	uint8 freq_index;

	/* reg0: 0-3=volume, 4=envelope, 5=hold, 6-7=duty cycle
	** reg1: 0-2=sweep shifts, 3=sweep inc/dec, 4-6=sweep length, 7=sweep on
	** reg2: 8 bits of freq
	** reg3: 0-2=high freq, 7-4=vbl length counter
	*/

	if (!chan->enabled || chan->Muted)
	{
		chan->output = 0;
		return;
	}

	/* enveloping */
	env_delay = info->sync_times1[chan->regs[0] & 0x0f];

	/* decay is at a rate of (env_regs + 1) / 240 secs */
	chan->env_phase -= 4;
	while (chan->env_phase < 0)
	{
		chan->env_phase += env_delay;
		if (chan->regs[0] & 0x20)
			chan->env_vol = (chan->env_vol + 1) & 15;
		else if (chan->env_vol < 15)
			chan->env_vol++;
	}

	/* vbl length counter */
	if (chan->vbl_length > 0 && !(chan->regs [0] & 0x20))
		chan->vbl_length--;

	if (!chan->vbl_length)
	{
		chan->output = 0;
		return;
	}

	/* freqsweeps */
	if ((chan->regs[1] & 0x80) && (chan->regs[1] & 7))
	{
		sweep_delay = info->sync_times1[(chan->regs[1] >> 4) & 7];
		chan->sweep_phase -= 2;
		while (chan->sweep_phase < 0)
		{
			chan->sweep_phase += sweep_delay;
			if (chan->regs[1] & 8)
				chan->freq -= chan->freq >> (chan->regs[1] & 7);
			else
				chan->freq += chan->freq >> (chan->regs[1] & 7);
		}
	}

	// Thanks to Delek for the fix
	if (chan->regs[1] & 0x80)
		freq_index = chan->regs[1] & 7;	//If sweeping is enabled, I choose it as normal.
	else
		freq_index = 7;	//If sweeping is disabled, I choose the lower limit.
	//if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[chan->regs[1] & 7])	// original
	if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[freq_index])	// fixed
		 || (chan->freq >> 16) < 4)
	{
		chan->output = 0;
		return;
	}

	chan->phaseacc -= (float) info->apu_incsize; /* # of cycles per sample */

	while (chan->phaseacc < 0)
	{
		chan->phaseacc += (chan->freq >> 16);
		chan->adder = (chan->adder + 1) & 0x0f;
	}

	if (chan->regs[0] & 0x10) /* fixed volume */
		chan->output = chan->regs[0] & 0x0F;
	else
		chan->output = 0x0f - chan->env_vol;

	//BIT( duty_lut[chan->regs[0] >> 6],  7 - BIT(chan->adder, 1, 3) );
	if (duty_lut[chan->regs[0] >> 6] & (1 << (7 - (chan->adder >> 1))))
		chan->output = -chan->output;
}